

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteMaterials(ColladaExporter *this)

{
  undefined1 *puVar1;
  vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  *this_00;
  string *psVar2;
  aiMaterial *pMat;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  string *psVar9;
  __type _Var10;
  aiReturn aVar11;
  ostream *poVar12;
  ulong value;
  string *psVar13;
  pointer pMVar14;
  Material *mat;
  unsigned_long value_00;
  Material *mat_1;
  long local_510;
  allocator<char> local_501;
  string *local_500;
  ColladaExporter *local_4f8;
  aiShadingMode shading;
  Surface *local_4d0;
  Surface *local_4c8;
  Surface *local_4c0;
  Surface *local_4b8;
  Surface *local_4b0;
  Surface *local_4a8;
  Surface *local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  aiString name;
  
  this_00 = &this->materials;
  std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ::resize(this_00,(ulong)this->mScene->mNumMaterials);
  local_500 = (string *)0x0;
  value = 0;
  local_510 = 0;
  local_4f8 = this;
  while( true ) {
    if (this->mScene->mNumMaterials <= value) break;
    pMat = this->mScene->mMaterials[value];
    name.length = 0;
    name.data[0] = '\0';
    memset(name.data + 1,0x1b,0x3ff);
    aVar11 = aiGetMaterialString(pMat,"?mat.name",0,0,&name);
    if (aVar11 == aiReturn_SUCCESS) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&shading,name.data,(allocator<char> *)&local_458);
      psVar9 = local_500;
      value_00 = 0;
      for (psVar13 = (string *)0x0; psVar9 != psVar13; psVar13 = psVar13 + 0x218) {
        _Var10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(psVar13 +
                                    (long)(this_00->
                                          super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                                          )._M_impl.super__Vector_impl_data._M_start),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&shading);
        value_00 = value_00 + _Var10;
      }
      if (value_00 == 0) {
        std::__cxx11::string::assign
                  ((char *)((this_00->
                            super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                            )._M_impl.super__Vector_impl_data._M_start + value));
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_498,name.data,&local_501);
        to_string<unsigned_long>(&local_478,value_00);
        std::operator+(&local_458,&local_498,&local_478);
        std::__cxx11::string::operator=
                  ((string *)
                   ((this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start + value),(string *)&local_458);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::~string((string *)&local_498);
      }
      std::__cxx11::string::~string((string *)&shading);
    }
    else {
      aiString::Set(&name,"mat");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"m",&local_501);
      to_string<unsigned_long>(&local_478,value);
      std::operator+(&local_458,&local_498,&local_478);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading,
                     &local_458,name.data);
      std::__cxx11::string::operator=
                ((string *)
                 ((this_00->
                  super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                  )._M_impl.super__Vector_impl_data._M_start + value),(string *)&shading);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_498);
    }
    shading = aiShadingMode_Flat;
    std::__cxx11::string::assign
              ((char *)&(this_00->
                        super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                        )._M_impl.super__Vector_impl_data._M_start[value].shading_model);
    aVar11 = aiMaterial::Get<aiShadingMode>(pMat,"$mat.shadingm",0,0,&shading);
    if (((aVar11 == aiReturn_SUCCESS) && (shading - aiShadingMode_Gouraud < 8)) &&
       ((0x87U >> (shading - aiShadingMode_Gouraud & 0x1f) & 1) != 0)) {
      std::__cxx11::string::assign
                ((char *)&(this_00->
                          super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                          )._M_impl.super__Vector_impl_data._M_start[value].shading_model);
    }
    this = local_4f8;
    ReadMaterialSurface(local_4f8,
                        &(local_4f8->materials).
                         super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                         ._M_impl.super__Vector_impl_data._M_start[value].ambient,pMat,
                        aiTextureType_AMBIENT,"$clr.ambient",0,0);
    pMVar14 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar3 = pMVar14[value].ambient.texture._M_string_length;
    ReadMaterialSurface(this,&pMVar14[value].diffuse,pMat,aiTextureType_DIFFUSE,"$clr.diffuse",0,0);
    pMVar14 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar4 = pMVar14[value].diffuse.texture._M_string_length;
    ReadMaterialSurface(this,&pMVar14[value].specular,pMat,aiTextureType_SPECULAR,"$clr.specular",0,
                        0);
    pMVar14 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar5 = pMVar14[value].specular.texture._M_string_length;
    ReadMaterialSurface(this,&pMVar14[value].emissive,pMat,aiTextureType_EMISSIVE,"$clr.emissive",0,
                        0);
    pMVar14 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar6 = pMVar14[value].emissive.texture._M_string_length;
    ReadMaterialSurface(this,&pMVar14[value].reflective,pMat,aiTextureType_REFLECTION,
                        "$clr.reflective",0,0);
    pMVar14 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar7 = pMVar14[value].reflective.texture._M_string_length;
    ReadMaterialSurface(this,&pMVar14[value].transparent,pMat,aiTextureType_OPACITY,
                        "$clr.transparent",0,0);
    pMVar14 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar8 = pMVar14[value].transparent.texture._M_string_length;
    ReadMaterialSurface(this,&pMVar14[value].normal,pMat,aiTextureType_NORMALS,(char *)0x0,0,0);
    pMVar14 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_510 = (((((((local_510 - (ulong)(sVar3 == 0)) - (ulong)(sVar4 == 0)) - (ulong)(sVar5 == 0)
                    ) - (ulong)(sVar6 == 0)) - (ulong)(sVar7 == 0)) - (ulong)(sVar8 == 0)) + 7) -
                (ulong)(pMVar14[value].normal.texture._M_string_length == 0);
    aVar11 = aiGetMaterialFloat(pMat,"$mat.shininess",0,0,&pMVar14[value].shininess.value);
    (this->materials).
    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
    ._M_impl.super__Vector_impl_data._M_start[value].shininess.exist = aVar11 == aiReturn_SUCCESS;
    aVar11 = aiGetMaterialFloat(pMat,"$mat.opacity",0,0,
                                &(this->materials).
                                 super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                                 ._M_impl.super__Vector_impl_data._M_start[value].transparency.value
                               );
    (this->materials).
    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
    ._M_impl.super__Vector_impl_data._M_start[value].transparency.exist = aVar11 == aiReturn_SUCCESS
    ;
    aVar11 = aiGetMaterialFloat(pMat,"$mat.refracti",0,0,
                                &(this->materials).
                                 super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                                 ._M_impl.super__Vector_impl_data._M_start[value].index_refraction.
                                 value);
    (this->materials).
    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
    ._M_impl.super__Vector_impl_data._M_start[value].index_refraction.exist =
         aVar11 == aiReturn_SUCCESS;
    value = value + 1;
    local_500 = local_500 + 0x218;
  }
  if (local_510 != 0) {
    puVar1 = &this->field_0x38;
    psVar2 = &this->startstr;
    poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar12 = std::operator<<(poVar12,"<library_images>");
    local_500 = (string *)&this->endstr;
    std::operator<<(poVar12,local_500);
    PushTag(this);
    pMVar14 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (; pMVar14 !=
           (this->materials).
           super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
           ._M_impl.super__Vector_impl_data._M_finish; pMVar14 = pMVar14 + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &pMVar14->name,"-ambient-image");
      WriteImageEntry(this,&pMVar14->ambient,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &pMVar14->name,"-diffuse-image");
      WriteImageEntry(this,&pMVar14->diffuse,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &pMVar14->name,"-specular-image");
      WriteImageEntry(this,&pMVar14->specular,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &pMVar14->name,"-emission-image");
      WriteImageEntry(this,&pMVar14->emissive,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &pMVar14->name,"-reflective-image");
      WriteImageEntry(this,&pMVar14->reflective,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &pMVar14->name,"-transparent-image");
      WriteImageEntry(this,&pMVar14->transparent,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &pMVar14->name,"-normal-image");
      WriteImageEntry(this,&pMVar14->normal,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      this = local_4f8;
    }
    PopTag(this);
    poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar12 = std::operator<<(poVar12,"</library_images>");
    std::operator<<(poVar12,local_500);
  }
  if ((this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar1 = &this->field_0x38;
    psVar2 = &this->startstr;
    poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar12 = std::operator<<(poVar12,"<library_effects>");
    local_500 = (string *)&this->endstr;
    std::operator<<(poVar12,local_500);
    PushTag(this);
    for (pMVar14 = (this->materials).
                   super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pMVar14 !=
        (this->materials).
        super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_finish; pMVar14 = pMVar14 + 1) {
      poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar12 = std::operator<<(poVar12,"<effect id=\"");
      XMLIDEncode((string *)&name,&pMVar14->name);
      poVar12 = std::operator<<(poVar12,(string *)&name);
      poVar12 = std::operator<<(poVar12,"-fx\" name=\"");
      XMLEscape((string *)&shading,&pMVar14->name);
      poVar12 = std::operator<<(poVar12,(string *)&shading);
      poVar12 = std::operator<<(poVar12,"\">");
      std::operator<<(poVar12,local_500);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      PushTag(this);
      poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar12 = std::operator<<(poVar12,"<profile_COMMON>");
      std::operator<<(poVar12,local_500);
      PushTag(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"emission",(allocator<char> *)&shading);
      local_4d0 = &pMVar14->emissive;
      WriteTextureParamEntry(this,local_4d0,(string *)&name,&pMVar14->name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"ambient",(allocator<char> *)&shading);
      local_4a0 = &pMVar14->ambient;
      WriteTextureParamEntry(this,local_4a0,(string *)&name,&pMVar14->name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"diffuse",(allocator<char> *)&shading);
      local_4a8 = &pMVar14->diffuse;
      WriteTextureParamEntry(this,local_4a8,(string *)&name,&pMVar14->name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"specular",(allocator<char> *)&shading);
      local_4b0 = &pMVar14->specular;
      WriteTextureParamEntry(this,local_4b0,(string *)&name,&pMVar14->name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"reflective",(allocator<char> *)&shading);
      WriteTextureParamEntry(this,&pMVar14->reflective,(string *)&name,&pMVar14->name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"transparent",(allocator<char> *)&shading);
      WriteTextureParamEntry(this,&pMVar14->transparent,(string *)&name,&pMVar14->name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"normal",(allocator<char> *)&shading);
      local_4c8 = &pMVar14->normal;
      local_4c0 = &pMVar14->transparent;
      local_4b8 = &pMVar14->reflective;
      WriteTextureParamEntry(this,local_4c8,(string *)&name,&pMVar14->name);
      std::__cxx11::string::~string((string *)&name);
      poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar12 = std::operator<<(poVar12,"<technique sid=\"standard\">");
      psVar9 = local_500;
      std::operator<<(poVar12,local_500);
      PushTag(this);
      poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar12 = std::operator<<(poVar12,"<");
      poVar12 = std::operator<<(poVar12,(string *)&pMVar14->shading_model);
      poVar12 = std::operator<<(poVar12,">");
      std::operator<<(poVar12,psVar9);
      PushTag(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"emission",(allocator<char> *)&local_458);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading,
                     &pMVar14->name,"-emission-sampler");
      WriteTextureColorEntry
                (this,local_4d0,(string *)&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"ambient",(allocator<char> *)&local_458);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading,
                     &pMVar14->name,"-ambient-sampler");
      WriteTextureColorEntry
                (this,local_4a0,(string *)&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"diffuse",(allocator<char> *)&local_458);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading,
                     &pMVar14->name,"-diffuse-sampler");
      WriteTextureColorEntry
                (this,local_4a8,(string *)&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"specular",(allocator<char> *)&local_458);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading,
                     &pMVar14->name,"-specular-sampler");
      WriteTextureColorEntry
                (this,local_4b0,(string *)&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"shininess",(allocator<char> *)&shading);
      WriteFloatEntry(this,&pMVar14->shininess,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"reflective",(allocator<char> *)&local_458);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading,
                     &pMVar14->name,"-reflective-sampler");
      WriteTextureColorEntry
                (this,local_4b8,(string *)&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"transparent",(allocator<char> *)&local_458);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading,
                     &pMVar14->name,"-transparent-sampler");
      WriteTextureColorEntry
                (this,local_4c0,(string *)&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"transparency",(allocator<char> *)&shading);
      WriteFloatEntry(this,&pMVar14->transparency,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"index_of_refraction",(allocator<char> *)&shading);
      WriteFloatEntry(this,&pMVar14->index_refraction,(string *)&name);
      local_4d0 = (Surface *)&pMVar14->shading_model;
      std::__cxx11::string::~string((string *)&name);
      if ((pMVar14->normal).texture._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,"bump",(allocator<char> *)&local_458);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading
                       ,&pMVar14->name,"-normal-sampler");
        WriteTextureColorEntry
                  (this,local_4c8,(string *)&name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&shading);
        std::__cxx11::string::~string((string *)&shading);
        std::__cxx11::string::~string((string *)&name);
      }
      PopTag(this);
      poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar12 = std::operator<<(poVar12,"</");
      poVar12 = std::operator<<(poVar12,(string *)local_4d0);
      poVar12 = std::operator<<(poVar12,">");
      psVar9 = local_500;
      std::operator<<(poVar12,local_500);
      PopTag(local_4f8);
      poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar12 = std::operator<<(poVar12,"</technique>");
      std::operator<<(poVar12,psVar9);
      PopTag(local_4f8);
      poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar12 = std::operator<<(poVar12,"</profile_COMMON>");
      std::operator<<(poVar12,psVar9);
      PopTag(local_4f8);
      this = local_4f8;
      poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar12 = std::operator<<(poVar12,"</effect>");
      std::operator<<(poVar12,psVar9);
    }
    PopTag(this);
    poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar12 = std::operator<<(poVar12,"</library_effects>");
    psVar9 = local_500;
    std::operator<<(poVar12,local_500);
    poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar12 = std::operator<<(poVar12,"<library_materials>");
    std::operator<<(poVar12,psVar9);
    PushTag(this);
    for (pMVar14 = (this->materials).
                   super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pMVar14 !=
        (this->materials).
        super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_finish; pMVar14 = pMVar14 + 1) {
      poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar12 = std::operator<<(poVar12,"<material id=\"");
      XMLIDEncode((string *)&name,&pMVar14->name);
      poVar12 = std::operator<<(poVar12,(string *)&name);
      poVar12 = std::operator<<(poVar12,"\" name=\"");
      XMLEscape((string *)&shading,&pMVar14->name);
      poVar12 = std::operator<<(poVar12,(string *)&shading);
      poVar12 = std::operator<<(poVar12,"\">");
      std::operator<<(poVar12,local_500);
      std::__cxx11::string::~string((string *)&shading);
      std::__cxx11::string::~string((string *)&name);
      PushTag(local_4f8);
      poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar12 = std::operator<<(poVar12,"<instance_effect url=\"#");
      XMLIDEncode((string *)&name,&pMVar14->name);
      poVar12 = std::operator<<(poVar12,(string *)&name);
      poVar12 = std::operator<<(poVar12,"-fx\"/>");
      std::operator<<(poVar12,local_500);
      std::__cxx11::string::~string((string *)&name);
      this = local_4f8;
      PopTag(local_4f8);
      poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar12 = std::operator<<(poVar12,"</material>");
      std::operator<<(poVar12,local_500);
    }
    PopTag(local_4f8);
    poVar12 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar12 = std::operator<<(poVar12,"</library_materials>");
    std::operator<<(poVar12,local_500);
  }
  return;
}

Assistant:

void ColladaExporter::WriteMaterials()
{
  materials.resize( mScene->mNumMaterials);

  /// collect all materials from the scene
  size_t numTextures = 0;
  for( size_t a = 0; a < mScene->mNumMaterials; ++a )
  {
    const aiMaterial* mat = mScene->mMaterials[a];

    aiString name;
    if( mat->Get( AI_MATKEY_NAME, name) != aiReturn_SUCCESS ) {
      name = "mat";
      materials[a].name = std::string( "m") + to_string(a) + name.C_Str();
    } else {
      // try to use the material's name if no other material has already taken it, else append #
      std::string testName = name.C_Str();
      size_t materialCountWithThisName = 0;
      for( size_t i = 0; i < a; i ++ ) {
        if( materials[i].name == testName ) {
          materialCountWithThisName ++;
        }
      }
      if( materialCountWithThisName == 0 ) {
        materials[a].name = name.C_Str();
      } else {
        materials[a].name = std::string(name.C_Str()) + to_string(materialCountWithThisName);
      }
    }

    aiShadingMode shading = aiShadingMode_Flat;
    materials[a].shading_model = "phong";
    if(mat->Get( AI_MATKEY_SHADING_MODEL, shading) == aiReturn_SUCCESS) {
        if(shading == aiShadingMode_Phong) {
            materials[a].shading_model = "phong";
        } else if(shading == aiShadingMode_Blinn) {
            materials[a].shading_model = "blinn";
        } else if(shading == aiShadingMode_NoShading) {
            materials[a].shading_model = "constant";
        } else if(shading == aiShadingMode_Gouraud) {
            materials[a].shading_model = "lambert";
        }
    }

    ReadMaterialSurface( materials[a].ambient, mat, aiTextureType_AMBIENT, AI_MATKEY_COLOR_AMBIENT);
    if( !materials[a].ambient.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].diffuse, mat, aiTextureType_DIFFUSE, AI_MATKEY_COLOR_DIFFUSE);
    if( !materials[a].diffuse.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].specular, mat, aiTextureType_SPECULAR, AI_MATKEY_COLOR_SPECULAR);
    if( !materials[a].specular.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].emissive, mat, aiTextureType_EMISSIVE, AI_MATKEY_COLOR_EMISSIVE);
    if( !materials[a].emissive.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].reflective, mat, aiTextureType_REFLECTION, AI_MATKEY_COLOR_REFLECTIVE);
    if( !materials[a].reflective.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].transparent, mat, aiTextureType_OPACITY, AI_MATKEY_COLOR_TRANSPARENT);
    if( !materials[a].transparent.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].normal, mat, aiTextureType_NORMALS, NULL, 0, 0);
    if( !materials[a].normal.texture.empty() ) numTextures++;

    materials[a].shininess.exist = mat->Get( AI_MATKEY_SHININESS, materials[a].shininess.value) == aiReturn_SUCCESS;
    materials[a].transparency.exist = mat->Get( AI_MATKEY_OPACITY, materials[a].transparency.value) == aiReturn_SUCCESS;
    materials[a].index_refraction.exist = mat->Get( AI_MATKEY_REFRACTI, materials[a].index_refraction.value) == aiReturn_SUCCESS;
  }

  // output textures if present
  if( numTextures > 0 )
  {
    mOutput << startstr << "<library_images>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      WriteImageEntry( mat.ambient, mat.name + "-ambient-image");
      WriteImageEntry( mat.diffuse, mat.name + "-diffuse-image");
      WriteImageEntry( mat.specular, mat.name + "-specular-image");
      WriteImageEntry( mat.emissive, mat.name + "-emission-image");
      WriteImageEntry( mat.reflective, mat.name + "-reflective-image");
      WriteImageEntry( mat.transparent, mat.name + "-transparent-image");
      WriteImageEntry( mat.normal, mat.name + "-normal-image");
    }
    PopTag();
    mOutput << startstr << "</library_images>" << endstr;
  }

  // output effects - those are the actual carriers of information
  if( !materials.empty() )
  {
    mOutput << startstr << "<library_effects>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      // this is so ridiculous it must be right
      mOutput << startstr << "<effect id=\"" << XMLIDEncode(mat.name) << "-fx\" name=\"" << XMLEscape(mat.name) << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<profile_COMMON>" << endstr;
      PushTag();

      // write sampler- and surface params for the texture entries
      WriteTextureParamEntry( mat.emissive, "emission", mat.name);
      WriteTextureParamEntry( mat.ambient, "ambient", mat.name);
      WriteTextureParamEntry( mat.diffuse, "diffuse", mat.name);
      WriteTextureParamEntry( mat.specular, "specular", mat.name);
      WriteTextureParamEntry( mat.reflective, "reflective", mat.name);
      WriteTextureParamEntry( mat.transparent, "transparent", mat.name);
      WriteTextureParamEntry( mat.normal, "normal", mat.name);

      mOutput << startstr << "<technique sid=\"standard\">" << endstr;
      PushTag();
      mOutput << startstr << "<" << mat.shading_model << ">" << endstr;
      PushTag();

      WriteTextureColorEntry( mat.emissive, "emission", mat.name + "-emission-sampler");
      WriteTextureColorEntry( mat.ambient, "ambient", mat.name + "-ambient-sampler");
      WriteTextureColorEntry( mat.diffuse, "diffuse", mat.name + "-diffuse-sampler");
      WriteTextureColorEntry( mat.specular, "specular", mat.name + "-specular-sampler");
      WriteFloatEntry(mat.shininess, "shininess");
      WriteTextureColorEntry( mat.reflective, "reflective", mat.name + "-reflective-sampler");
      WriteTextureColorEntry( mat.transparent, "transparent", mat.name + "-transparent-sampler");
      WriteFloatEntry(mat.transparency, "transparency");
      WriteFloatEntry(mat.index_refraction, "index_of_refraction");

      if(! mat.normal.texture.empty()) {
        WriteTextureColorEntry( mat.normal, "bump", mat.name + "-normal-sampler");
      }

      PopTag();
      mOutput << startstr << "</" << mat.shading_model << ">" << endstr;
      PopTag();
      mOutput << startstr << "</technique>" << endstr;
      PopTag();
      mOutput << startstr << "</profile_COMMON>" << endstr;
      PopTag();
      mOutput << startstr << "</effect>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_effects>" << endstr;

    // write materials - they're just effect references
    mOutput << startstr << "<library_materials>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      mOutput << startstr << "<material id=\"" << XMLIDEncode(mat.name) << "\" name=\"" << XMLEscape(mat.name) << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<instance_effect url=\"#" << XMLIDEncode(mat.name) << "-fx\"/>" << endstr;
      PopTag();
      mOutput << startstr << "</material>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_materials>" << endstr;
  }
}